

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O3

ON_RenderMeshInfo * __thiscall ON_Mesh::GetRenderMeshInfo(ON_Mesh *this)

{
  bool bVar1;
  ON_UserData *this_00;
  ON_UUID local_18;
  
  local_18 = ON_ClassId::Uuid(&CTtRenderMeshInfoUserData::m_CTtRenderMeshInfoUserData_class_rtti);
  this_00 = ON_Object::GetUserData((ON_Object *)this,&local_18);
  if ((this_00 != (ON_UserData *)0x0) &&
     (bVar1 = ON_Object::IsKindOf(&this_00->super_ON_Object,
                                  &CTtRenderMeshInfoUserData::m_CTtRenderMeshInfoUserData_class_rtti
                                 ), bVar1)) {
    return (ON_RenderMeshInfo *)(this_00 + 1);
  }
  return (ON_RenderMeshInfo *)0x0;
}

Assistant:

const ON_RenderMeshInfo* ON_Mesh::GetRenderMeshInfo() const
{
  CTtRenderMeshInfoUserData* pUD = CTtRenderMeshInfoUserData::Cast(GetUserData(ON_CLASS_ID(CTtRenderMeshInfoUserData)));
  if (nullptr == pUD)
    return nullptr;
  return &pUD->Info();
}